

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VWAP.cpp
# Opt level: O0

double __thiscall VWAPOption::simulateSinglePath(VWAPOption *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int local_13dc;
  int i;
  double sigmaX2;
  double muX;
  double Uti;
  double Xti;
  double Sti;
  double sumUt;
  double sumStUt;
  mt19937 gen;
  int seed;
  VWAPOption *this_local;
  
  gen._M_p._4_4_ = 0xffffff95;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&sumStUt,0xffffffffffffff95);
  sumUt = this->S0_ * this->X0_ * this->X0_;
  Sti = this->X0_ * this->X0_;
  Xti = this->S0_;
  Uti = this->X0_;
  dVar1 = this->a_;
  dVar5 = exp(-this->lambda_ * this->delta_);
  dVar6 = pow(this->sigmaVol_,2.0);
  dVar2 = this->lambda_;
  dVar7 = exp(this->lambda_ * -2.0 * this->delta_);
  for (local_13dc = 1; local_13dc <= this->numIncrements_; local_13dc = local_13dc + 1) {
    dVar9 = this->mu_;
    dVar10 = this->sigmaPrice_;
    dVar11 = this->sigmaPrice_;
    dVar3 = this->delta_;
    dVar4 = this->sigmaPrice_;
    dVar8 = sqrt(this->delta_);
    dVar9 = exp((-(dVar10 * 0.5) * dVar11 + dVar9) * dVar3 + dVar4 * dVar8);
    dVar10 = GetNormDistrDouble(this,(mt19937 *)&sumStUt);
    Xti = Xti * dVar9 * dVar10;
    dVar9 = exp(-this->lambda_ * this->delta_);
    dVar10 = sqrt((dVar6 / (dVar2 * 2.0)) * (1.0 - dVar7));
    dVar11 = GetNormDistrDouble(this,(mt19937 *)&sumStUt);
    Uti = dVar10 * dVar11 + dVar9 * Uti + dVar1 * (1.0 - dVar5);
    dVar9 = pow(Uti,2.0);
    sumUt = Xti * dVar9 + sumUt;
    Sti = dVar9 + Sti;
  }
  return sumUt / Sti;
}

Assistant:

double VWAPOption::simulateSinglePath() {
    int seed = -107;
    std::mt19937 gen(seed);

    double sumStUt = S0_*X0_*X0_;
    double sumUt   = X0_*X0_;

    double Sti = S0_;
    double Xti = X0_;
    double Uti = 0.0;
    const double muX = a_*(1-exp(-lambda_ * delta_));
    const double sigmaX2 = pow(sigmaVol_,2)/(2*lambda_)*(1-exp(-2*lambda_*delta_));

    //simulate path over [0,T]
    for (int i = 1; i <= numIncrements_; i++) {
        Sti = Sti*exp((mu_-0.5*sigmaPrice_*sigmaPrice_)*delta_
                      + sigmaPrice_*sqrt(delta_))*GetNormDistrDouble(gen);

        Xti = exp(-lambda_*delta_)*Xti + muX + sqrt(sigmaX2)*GetNormDistrDouble(gen);
        Uti = pow(Xti,2);

        sumStUt+= Sti*Uti;
        sumUt += Uti;
    }

    return (sumStUt/sumUt);
}